

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void my_serialization_example(ChArchiveOut *marchive)

{
  mapped_type *pmVar1;
  myEmployeeBoss *this;
  myEmployeeCustomConstructor *this_00;
  int m_int;
  ChVector<double> *mvp1;
  myEmployeeBoss *a_boss;
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> vect_of_pointers;
  ChVector<double> *mvp2;
  shared_ptr<myEmployeeBoss> s_boss;
  ChVector<double> *a_vect;
  char m_text [12];
  double m_double;
  vector<double,_std::allocator<double>_> m_stlvector;
  shared_ptr<myEmployeeBoss> null_boss;
  shared_ptr<myEmployee> s_boss_b;
  pair<int,_double> m_stlpair;
  ChMatrixDynamic<double> m_matr_dyn;
  list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> m_stllist;
  ChVector<double> local_3e8;
  double m_array [3];
  myEmployeeCustomConstructor *mcustomconstr;
  myEmployeeBoss *a_boss2;
  ChVector<double> *a_null_ptr;
  string m_string;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  m_stlunorderedmap;
  myEmployeeBoss m_boss;
  ChQuaternion<double> local_2a8;
  ChMatrixNM<double,_2,_3> m_matr_NM;
  ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
  local_258;
  ChNameValue<myEmployeeCustomConstructor_*> local_240;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_228;
  ChNameValue<std::shared_ptr<myEmployee>_> local_210;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_1f8;
  ChNameValue<myEmployeeBoss_*> local_1e0;
  ChNameValue<myEmployeeBoss_*> local_1c8;
  ChNameValue<chrono::ChVector<double>_*> local_1b0;
  ChNameValue<chrono::ChVector<double>_*> local_198;
  ChNameValue<myEmployeeBoss> local_180;
  ChNameValue<chrono::ChQuaternion<double>_> local_168;
  ChNameValue<chrono::ChVector<double>_> local_150;
  ChNameValue<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_138;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_120;
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_108;
  ChNameValue<std::pair<int,_double>_> local_f0;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_d8;
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_c0;
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  ChNameValue<char[12]> local_90;
  ChNameValue<double[3]> local_78;
  ChNameValue<int> local_60;
  ChNameValue<double> local_48;
  
  m_int = -0x7b;
  builtin_strncpy(m_text + 8,"ing",4);
  m_double = 0.123456;
  m_array[2] = 16.5;
  builtin_strncpy(m_text,"test str",8);
  m_array[0] = 13.1;
  m_array[1] = 15.3;
  std::__cxx11::string::string((string *)&m_string,"hey! stl string",(allocator *)&m_boss);
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  m_stlvector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  m_boss.super_myEmployee._vptr_myEmployee = (_func_int **)0x4002666666666666;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&m_stlvector,(double *)&m_boss)
  ;
  m_boss.super_myEmployee._vptr_myEmployee = (_func_int **)0x4046a66666666666;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&m_stlvector,(double *)&m_boss)
  ;
  m_boss.super_myEmployee._vptr_myEmployee = (_func_int **)0x40509c28f5c28f5c;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&m_stlvector,(double *)&m_boss)
  ;
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&m_stllist;
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node._M_size = 0;
  m_boss.super_myEmployee._vptr_myEmployee = (_func_int **)0x3ff0000000000000;
  m_boss.super_myEmployee.age = 0;
  m_boss.super_myEmployee._12_4_ = 0x40000000;
  m_boss.super_myEmployee.wages = 3.0;
  m_stllist.super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       m_stllist.
       super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  push_back((list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
            m_stllist.
            super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
            _M_impl._M_node.super__List_node_base._M_next,(value_type *)&m_boss);
  m_boss.super_myEmployee._vptr_myEmployee = (_func_int **)0x4008000000000000;
  m_boss.super_myEmployee.age = 0;
  m_boss.super_myEmployee._12_4_ = 0x40100000;
  m_boss.super_myEmployee.wages = 5.0;
  std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  push_back(&m_stllist,(value_type *)&m_boss);
  m_stlunorderedmap._M_h._M_buckets = &m_stlunorderedmap._M_h._M_single_bucket;
  m_stlpair.first = 0x78;
  m_stlunorderedmap._M_h._M_bucket_count = 1;
  m_stlunorderedmap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  m_stlunorderedmap._M_h._M_element_count = 0;
  m_stlunorderedmap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  m_stlpair.second = 0.99;
  m_stlunorderedmap._M_h._M_rehash_policy._M_next_resize = 0;
  m_stlunorderedmap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  m_boss.super_myEmployee._vptr_myEmployee =
       (_func_int **)CONCAT44(m_boss.super_myEmployee._vptr_myEmployee._4_4_,0xc);
  pmVar1 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&m_stlunorderedmap,(key_type *)&m_boss);
  *pmVar1 = 11.2;
  m_boss.super_myEmployee._vptr_myEmployee =
       (_func_int **)CONCAT44(m_boss.super_myEmployee._vptr_myEmployee._4_4_,0x29);
  pmVar1 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&m_stlunorderedmap,(key_type *)&m_boss);
  *pmVar1 = 44.8;
  m_boss.super_myEmployee._vptr_myEmployee =
       (_func_int **)CONCAT44(m_boss.super_myEmployee._vptr_myEmployee._4_4_,0x22);
  pmVar1 = std::__detail::
           _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&m_stlunorderedmap,(key_type *)&m_boss);
  *pmVar1 = 33.6;
  m_boss.super_myEmployee._vptr_myEmployee =
       (_func_int **)CONCAT44(m_boss.super_myEmployee._vptr_myEmployee._4_4_,3);
  m_matr_NM.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>.m_storage.m_data.array[0].
  _0_4_ = 5;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&m_matr_dyn,(int *)&m_boss,(int *)&m_matr_NM);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&m_matr_dyn,0.0,10.0);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::fillRandom
            ((MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&m_matr_NM,-1.0,1.0);
  local_3e8.m_data[0] = 0.5;
  local_3e8.m_data[1] = 0.6;
  local_3e8.m_data[2] = 0.7;
  local_2a8.m_data[0] = 0.1;
  local_2a8.m_data[1] = 0.2;
  local_2a8.m_data[2] = 0.3;
  local_2a8.m_data[3] = 0.4;
  local_48._name = "custom_double";
  local_48._value = &m_double;
  local_48._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &m_int;
  local_60._name = "m_int";
  local_60._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &m_array;
  local_78._name = "m_array";
  local_78._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_78);
  local_90._value = &m_text;
  local_90._name = "m_text";
  local_90._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_90);
  local_a8._value = &m_string;
  local_a8._name = "m_string";
  local_a8._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_a8);
  local_c0._name = "m_stlvector";
  local_c0._flags = '\0';
  local_c0._value = &m_stlvector;
  chrono::ChArchiveOut::operator<<(marchive,&local_c0);
  local_d8._name = "m_stllist";
  local_d8._flags = '\0';
  local_d8._value = &m_stllist;
  chrono::ChArchiveOut::operator<<(marchive,&local_d8);
  local_f0._value = &m_stlpair;
  local_f0._name = "m_stlpair";
  local_f0._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_f0);
  local_108._name = "m_stlunorderedmap";
  local_108._flags = '\0';
  local_108._value = &m_stlunorderedmap;
  chrono::ChArchiveOut::operator<<(marchive,&local_108);
  local_120._name = "m_matr_dyn";
  local_120._flags = '\0';
  local_120._value = (Matrix<double,__1,__1,_1,__1,__1> *)&m_matr_dyn;
  chrono::ChArchiveOut::operator<<(marchive,&local_120);
  local_138._name = "m_matr_NM";
  local_138._flags = '\0';
  local_138._value = (Matrix<double,_2,_3,_1,_2,_3> *)&m_matr_NM;
  chrono::ChArchiveOut::operator<<(marchive,&local_138);
  local_150._value = &local_3e8;
  local_150._name = "m_vect";
  local_150._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_150);
  local_168._value = &local_2a8;
  local_168._name = "m_quaternion";
  local_168._flags = '\x01';
  chrono::ChArchiveOut::operator<<(marchive,&local_168);
  myEmployeeBoss::myEmployeeBoss(&m_boss,0x35,12000.34,true);
  m_boss.super_myEmployee.body = FAT;
  local_180._name = "m_boss";
  local_180._flags = '\0';
  local_180._value = &m_boss;
  chrono::ChArchiveOut::operator<<(marchive,&local_180);
  a_vect = (ChVector<double> *)operator_new(0x18);
  local_198._value = &a_vect;
  local_198._name = "a_vect";
  local_198._flags = '\0';
  a_vect->m_data[0] = 1.0;
  a_vect->m_data[1] = 2.0;
  a_vect->m_data[2] = 3.0;
  chrono::ChArchiveOut::operator<<(marchive,&local_198);
  operator_delete(a_vect,0x18);
  local_1b0._value = &a_null_ptr;
  a_null_ptr = (ChVector<double> *)0x0;
  local_1b0._name = "a_null_ptr";
  local_1b0._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_1b0);
  this = (myEmployeeBoss *)operator_new(0x88);
  myEmployeeBoss::myEmployeeBoss(this,0x40,22356.0,false);
  local_1c8._value = &a_boss;
  (this->slave).age = 0x18;
  local_1c8._name = "a_boss";
  local_1c8._flags = '\0';
  a_boss = this;
  chrono::ChArchiveOut::operator<<(marchive,&local_1c8);
  local_1e0._value = &a_boss2;
  local_1e0._name = "a_boss2";
  local_1e0._flags = '\0';
  a_boss2 = a_boss;
  chrono::ChArchiveOut::operator<<(marchive,&local_1e0);
  std::make_shared<myEmployeeBoss>();
  local_1f8._name = "s_boss";
  local_1f8._flags = '\0';
  local_1f8._value = &s_boss;
  chrono::ChArchiveOut::operator<<(marchive,&local_1f8);
  std::__shared_ptr<myEmployee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myEmployeeBoss,void>
            ((__shared_ptr<myEmployee,(__gnu_cxx::_Lock_policy)2> *)&s_boss_b,
             &s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>);
  local_210._name = "s_boss_b";
  local_210._flags = '\0';
  local_210._value = &s_boss_b;
  chrono::ChArchiveOut::operator<<(marchive,&local_210);
  local_228._value = &null_boss;
  local_228._name = "null_boss";
  null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_228._flags = '\0';
  chrono::ChArchiveOut::operator<<(marchive,&local_228);
  this_00 = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor::myEmployeeCustomConstructor(this_00,3,40.0);
  local_240._value = &mcustomconstr;
  local_240._name = "mcustomconstr";
  local_240._flags = '\0';
  mcustomconstr = this_00;
  chrono::ChArchiveOut::operator<<(marchive,&local_240);
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vect_of_pointers.
  super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mvp1 = (ChVector<double> *)operator_new(0x18);
  mvp1->m_data[0] = 1.0;
  mvp1->m_data[1] = 2.0;
  mvp1->m_data[2] = 3.0;
  mvp2 = (ChVector<double> *)operator_new(0x18);
  mvp2->m_data[0] = 7.0;
  mvp2->m_data[1] = 8.0;
  mvp2->m_data[2] = 7.0;
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::push_back
            (&vect_of_pointers,&mvp1);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::push_back
            (&vect_of_pointers,&mvp2);
  chrono::ChArchiveOut::UnbindExternalPointer(marchive,mvp1,0x3e9);
  local_258._name = "vect_of_pointers";
  local_258._flags = '\0';
  local_258._value = &vect_of_pointers;
  chrono::ChArchiveOut::operator<<(marchive,&local_258);
  if (a_boss != (myEmployeeBoss *)0x0) {
    (*(a_boss->super_myEmployee)._vptr_myEmployee[1])();
  }
  std::_Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::
  ~_Vector_base(&vect_of_pointers.
                 super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&null_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s_boss_b.super___shared_ptr<myEmployee,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&s_boss.super___shared_ptr<myEmployeeBoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  myEmployeeBoss::~myEmployeeBoss(&m_boss);
  Eigen::internal::handmade_aligned_free
            (m_matr_dyn.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_data);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&m_stlunorderedmap._M_h);
  std::__cxx11::_List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  _M_clear(&m_stllist.
            super__List_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&m_stlvector.super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&m_string);
  return;
}

Assistant:

void my_serialization_example(ChArchiveOut& marchive)
{
        // All basic primitives (strings, int,etc.), plus and objects that has
        // an ArchiveOUT() function defined can be serialized in archives.      

        // Write from transient data into persistent binary file
        double m_double = 0.123456;
        int m_int = -123;
        double m_array[] = {13.1, 15.3, 16.5};
        char m_text[] = "test string"; // better use std::string
        std::string m_string = "hey! stl string";
        std::vector< double > m_stlvector; 
        m_stlvector.push_back (2.3); 
        m_stlvector.push_back (45.3);
        m_stlvector.push_back (66.44);
        std::list< ChVector<> > m_stllist; 
        m_stllist.push_back ( ChVector<>(1,2,3) ); 
        m_stllist.push_back ( ChVector<>(3,4,5) );
        std::pair<int, double> m_stlpair(120, 0.99);
        std::unordered_map<int, double> m_stlunorderedmap;
        m_stlunorderedmap[12]=11.2;
        m_stlunorderedmap[41]=44.8;
        m_stlunorderedmap[34]=33.6; 
        ChMatrixDynamic<double> m_matr_dyn(3, 5);
        m_matr_dyn.fillRandom(0, 10);
		ChMatrixNM<double,2,3> m_matr_NM;
        m_matr_NM.fillRandom(-1, +1);
        ChVector<> m_vect(0.5, 0.6, 0.7);
        ChQuaternion<> m_quat(0.1, 0.2, 0.3, 0.4);
 
        marchive << CHNVP(m_double,"custom_double");  // store data n.1      
        marchive << CHNVP(m_int);     // store data n.2 
        marchive << CHNVP(m_array);   // store data n.3
        marchive << CHNVP(m_text);    // store data n....
        marchive << CHNVP(m_string);  
        marchive << CHNVP(m_stlvector);
        marchive << CHNVP(m_stllist);
        marchive << CHNVP(m_stlpair);
        marchive << CHNVP(m_stlunorderedmap);
        marchive << CHNVP(m_matr_dyn);
		marchive << CHNVP(m_matr_NM);
        marchive << CHNVP(m_vect);
        marchive << CHNVP(m_quat, "m_quaternion", NVP_TRACK_OBJECT);  
        
        // Also store a c++ object 
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        myEmployeeBoss m_boss(53, 12000.34, true);
        m_boss.body = FAT;
        marchive << CHNVP(m_boss);    

        // Also store a c++ objects referenced by pointer(s).
        // One could have multiple pointers to the same object: 
        // the serialization of pointers takes care of redundancy.
        // In order to use this feature, the classes must implement 
        // ArchiveIN and ArchiveOUT functions.
        ChVector<>* a_vect = new ChVector<>(1,2,3); 
        marchive << CHNVP(a_vect);
        delete a_vect;

        // Null pointers can be serialized. They will be deserialized as null.
        ChVector<>* a_null_ptr = 0; 
        marchive << CHNVP(a_null_ptr);

        // Also store c++ objects referenced by pointer, using the
        // class abstraction (class factory) mechanism, so that it
        // can be loaded later even if we do not know if it was an object of
        // class 'myEmployee' or specialized class 'myEmployeeBoss'...
        // In order to use this feature, classes must use the CH_FACTORY_REGISTER macros, 
        // and must implement ArchiveIN() and ArchiveOUT().
        myEmployeeBoss* a_boss = new myEmployeeBoss(64, 22356, false);
        a_boss->slave.age = 24;
        marchive << CHNVP(a_boss);  //  object was referenced by pointer.

        // If another pointer shares the same object instance, you can serialize
        // it too without worrying, because the serialization system will save only
        // the first copy and following copies will just use references.

        myEmployeeBoss* a_boss2 = a_boss;
        marchive << CHNVP(a_boss2);  //  object was referenced by pointer.

        // Also store c++ objects referenced by shared pointers.
        // If classes of pointed objects used CH_FACTORY_REGISTER, class abstraction
        // will be automatically used.
        auto s_boss = chrono_types::make_shared<myEmployeeBoss>();
        marchive << CHNVP(s_boss);  //  object was referenced by shared pointer.

        // Serialize a shared pointer pointing to the same shared resource of s_boss. 
        // Note, base class works fine too, as polymorphic object.
        std::shared_ptr<myEmployee> s_boss_b(s_boss);
        marchive << CHNVP(s_boss_b);

        // Serialize null shared pointer
        std::shared_ptr<myEmployeeBoss> null_boss;
        marchive << CHNVP(null_boss); 

        // Serialize an object with non-default constructor:
        myEmployeeCustomConstructor* mcustomconstr = new myEmployeeCustomConstructor(3,40);
        marchive << CHNVP(mcustomconstr); 

        // Serialize an object where some pointers are un-linked as external, marking them with unique IDs
        std::vector<ChVector<>*> vect_of_pointers;
        ChVector<>* mvp1 = new ChVector<>(1,2,3);
        ChVector<>* mvp2 = new ChVector<>(7,8,7);
        vect_of_pointers.push_back(mvp1);
        vect_of_pointers.push_back(mvp2);
        // define that some object should not be serialized, but rather marked with ID for later rebinding
        marchive.UnbindExternalPointer(mvp1, 1001); // use unique identifier > 0
        marchive << CHNVP(vect_of_pointers);

        delete a_boss;
}